

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O0

void __thiscall
QAbstractFileEngineIterator::~QAbstractFileEngineIterator(QAbstractFileEngineIterator *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__QAbstractFileEngineIterator_002009f8;
  QString::~QString((QString *)0x191b7e);
  QList<QString>::~QList((QList<QString> *)0x191b8c);
  QFileInfo::~QFileInfo((QFileInfo *)0x191b9a);
  return;
}

Assistant:

QAbstractFileEngineIterator::~QAbstractFileEngineIterator()
{
}